

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O3

bool __thiscall
EthBasePort::ReadBlockNode
          (EthBasePort *this,nodeid_t node,nodeaddr_t addr,quadlet_t *rdata,uint nbytes,uchar flags)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  uchar *puVar5;
  undefined6 in_register_00000032;
  EthBasePort *this_00;
  uchar local_68;
  long *local_50 [2];
  long local_40 [2];
  
  if ((int)CONCAT62(in_register_00000032,node) != 0x3f) {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"ReadBlock","");
    iVar2 = (*(this->super_BasePort)._vptr_BasePort[0x1b])(this,(string *)local_50,0);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if ((char)iVar2 == '\0') {
      return false;
    }
  }
  iVar2 = (*(this->super_BasePort)._vptr_BasePort[0x2f])(this);
  if (0 < iVar2) {
    poVar4 = (this->super_BasePort).outStr;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"ReadBlock: flushed ",0x13);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," packets",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  BasePort::SetGenericBuffer(&this->super_BasePort);
  puVar5 = (this->super_BasePort).GenericBuffer;
  uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x17])(this);
  puVar5 = puVar5 + uVar3;
  iVar2 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,1);
  this->fw_tl = this->fw_tl + 1 & 0x3f;
  (*(this->super_BasePort)._vptr_BasePort[0x31])
            (this,puVar5,(ulong)(iVar2 + 0x14U),(ulong)node,flags);
  uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,0);
  puVar5[uVar3] = '\0';
  if (((flags & 0x40) != 0) || (this->useFwBridge == false)) {
    puVar5[uVar3] = '\x01';
  }
  puVar5[uVar3 + 1] = (uchar)(this->super_BasePort).FwBusGeneration;
  this_00 = this;
  uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,1);
  make_bread_packet(this_00,(quadlet_t *)(puVar5 + uVar3),node,addr,nbytes,(uint)this->fw_tl);
  iVar2 = (*(this->super_BasePort)._vptr_BasePort[0x2d])
                    (this,(ulong)node,puVar5,(ulong)(iVar2 + 0x14U),(ulong)(flags >> 7));
  if ((char)iVar2 != '\0') {
    if (this->eth_read_callback != (EthCallbackType)0x0) {
      local_68 = (uchar)node;
      bVar1 = (*this->eth_read_callback)(this,local_68,(this->super_BasePort).outStr);
      if (!bVar1) {
        poVar4 = (this->super_BasePort).outStr;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,"ReadBlock: callback aborting (not reading packet)",0x31);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        return false;
      }
    }
    bVar1 = ReceiveResponseNode(this,node,rdata,nbytes,this->fw_tl,(nodeid_t *)0x0);
    return bVar1;
  }
  return false;
}

Assistant:

bool EthBasePort::ReadBlockNode(nodeid_t node, nodeaddr_t addr, quadlet_t *rdata,
                                unsigned int nbytes, unsigned char flags)
{
    if ((node != FW_NODE_BROADCAST) && !CheckFwBusGeneration("ReadBlock"))
        return false;

    // Flush before reading
    int numFlushed = PacketFlushAll();
    if (numFlushed > 0)
        outStr << "ReadBlock: flushed " << numFlushed << " packets" << std::endl;

    // Create buffer that is large enough for Firewire packet
    SetGenericBuffer();   // Make sure buffer is allocated
    unsigned char *sendPacket = GenericBuffer+GetWriteQuadAlign();
    unsigned int sendPacketSize = GetPrefixOffset(WR_FW_HEADER)+FW_BREAD_SIZE;

    // Increment transaction label
    fw_tl = (fw_tl+1)&FW_TL_MASK;

    // Make Ethernet header (only needed for raw Ethernet)
    make_ethernet_header(sendPacket, sendPacketSize, node, flags);

    // Make control word
    make_write_header(sendPacket, sendPacketSize, flags);

    // Build FireWire packet
    make_bread_packet(reinterpret_cast<quadlet_t *>(sendPacket+GetPrefixOffset(WR_FW_HEADER)), node, addr, nbytes, fw_tl);
    if (!PacketSend(node, sendPacket, sendPacketSize, flags&FW_NODE_ETH_BROADCAST_MASK))
        return false;

    // Invoke callback (if defined) between sending read request
    // and checking for read response. If callback returns false, we
    // skip checking for a received packet.
    if (eth_read_callback && !(*eth_read_callback)(*this, node, outStr)) {
        outStr << "ReadBlock: callback aborting (not reading packet)" << std::endl;
        return false;
    }

    return ReceiveResponseNode(node, rdata, nbytes, fw_tl);
}